

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# output.h
# Opt level: O2

unique_ptr<testinator::Outputter,_std::default_delete<testinator::Outputter>_> __thiscall
testinator::MakeOutputter(testinator *this,string *name,OutputFlags flags)

{
  bool bVar1;
  undefined8 local_20;
  OutputFlags local_14;
  
  *(undefined8 *)this = 0;
  local_14 = flags;
  bVar1 = std::operator==(name,"TAP");
  if (bVar1) {
    std::make_unique<testinator::TAPOutputter>();
  }
  else {
    std::make_unique<testinator::DefaultOutputter,std::ostream&,testinator::OutputFlags&>
              ((basic_ostream<char,_std::char_traits<char>_> *)&local_20,(OutputFlags *)&std::cout);
  }
  *(undefined8 *)this = local_20;
  return (__uniq_ptr_data<testinator::Outputter,_std::default_delete<testinator::Outputter>,_true,_true>
          )(__uniq_ptr_data<testinator::Outputter,_std::default_delete<testinator::Outputter>,_true,_true>
            )this;
}

Assistant:

inline std::unique_ptr<Outputter> MakeOutputter(
      const std::string& name,
      OutputFlags flags)
  {
    std::unique_ptr<Outputter> op;
    if (name == "TAP")
      op = std::make_unique<TAPOutputter>();
    else
      op = std::make_unique<DefaultOutputter>(std::cout, flags);
    return op;
  }